

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR lyd_any_copy_value(lyd_node *trg,lyd_any_value *value,LYD_ANYDATA_VALUETYPE value_type)

{
  lyd_node *dup;
  lysc_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  lyd_node *__dest;
  char *pcVar4;
  lys_module *plVar5;
  
  if (trg == (lyd_node *)0x0) {
    pcVar4 = "trg";
  }
  else {
    plVar1 = trg->schema;
    if (plVar1 == (lysc_node *)0x0) {
      pcVar4 = "trg->schema";
    }
    else {
      if ((plVar1->nodetype & 0x60) != 0) {
        iVar2 = *(int *)&trg[1].schema;
        if (iVar2 - 1U < 3) {
          lydict_remove(plVar1->module->ctx,*(char **)(trg + 1));
        }
        else if (iVar2 == 4) {
          free(*(void **)(trg + 1));
        }
        else if (iVar2 == 0) {
          lyd_free_all(*(lyd_node **)(trg + 1));
        }
        trg[1].hash = 0;
        trg[1].flags = 0;
        if (value == (lyd_any_value *)0x0) {
          return LY_SUCCESS;
        }
        dup = trg + 1;
        *(LYD_ANYDATA_VALUETYPE *)&trg[1].schema = value_type;
        if (value_type - LYD_ANYDATA_STRING < 3) {
          if (value->str == (char *)0x0) {
            return LY_SUCCESS;
          }
          if (trg->schema == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&trg[2].schema;
          }
          else {
            plVar5 = trg->schema->module;
          }
          LVar3 = lydict_insert(plVar5->ctx,value->str,0,(char **)dup);
        }
        else {
          if (value_type == LYD_ANYDATA_LYB) {
            if (value->str == (char *)0x0) {
              return LY_SUCCESS;
            }
            iVar2 = lyd_lyb_data_length(value->str);
            if (iVar2 != -1) {
              __dest = (lyd_node *)malloc((long)iVar2);
              *(lyd_node **)dup = __dest;
              if (__dest != (lyd_node *)0x0) {
                memcpy(__dest,value->tree,(long)iVar2);
                return LY_SUCCESS;
              }
              if (trg->schema == (lysc_node *)0x0) {
                plVar5 = (lys_module *)&trg[2].schema;
              }
              else {
                plVar5 = trg->schema->module;
              }
              ly_log(plVar5->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyd_any_copy_value");
              return LY_EMEM;
            }
            return LY_EINVAL;
          }
          if (value_type != LYD_ANYDATA_DATATREE) {
            return LY_SUCCESS;
          }
          if (value->tree == (lyd_node *)0x0) {
            return LY_SUCCESS;
          }
          LVar3 = lyd_dup_siblings(value->tree,(lyd_node_inner *)0x0,1,(lyd_node **)dup);
        }
        if (LVar3 == LY_SUCCESS) {
          return LY_SUCCESS;
        }
        return LVar3;
      }
      pcVar4 = "trg->schema->nodetype & 0x0060";
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"lyd_any_copy_value")
  ;
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_any_copy_value(struct lyd_node *trg, const union lyd_any_value *value, LYD_ANYDATA_VALUETYPE value_type)
{
    struct lyd_node_any *t;

    LY_CHECK_ARG_RET(NULL, trg, LY_EINVAL);
    LY_CHECK_ARG_RET(NULL, trg->schema, trg->schema->nodetype & LYS_ANYDATA, LY_EINVAL);

    t = (struct lyd_node_any *)trg;

    /* free trg */
    switch (t->value_type) {
    case LYD_ANYDATA_DATATREE:
        lyd_free_all(t->value.tree);
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_XML:
    case LYD_ANYDATA_JSON:
        lydict_remove(LYD_CTX(trg), t->value.str);
        break;
    case LYD_ANYDATA_LYB:
        free(t->value.mem);
        break;
    }
    t->value.str = NULL;

    if (!value) {
        /* only free value in this case */
        return LY_SUCCESS;
    }

    /* copy src */
    t->value_type = value_type;
    switch (value_type) {
    case LYD_ANYDATA_DATATREE:
        if (value->tree) {
            LY_CHECK_RET(lyd_dup_siblings(value->tree, NULL, LYD_DUP_RECURSIVE, &t->value.tree));
        }
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_XML:
    case LYD_ANYDATA_JSON:
        if (value->str) {
            LY_CHECK_RET(lydict_insert(LYD_CTX(trg), value->str, 0, &t->value.str));
        }
        break;
    case LYD_ANYDATA_LYB:
        if (value->mem) {
            int len = lyd_lyb_data_length(value->mem);

            LY_CHECK_RET(len == -1, LY_EINVAL);
            t->value.mem = malloc(len);
            LY_CHECK_ERR_RET(!t->value.mem, LOGMEM(LYD_CTX(trg)), LY_EMEM);
            memcpy(t->value.mem, value->mem, len);
        }
        break;
    }

    return LY_SUCCESS;
}